

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O3

Accel * __thiscall embree::BVH8Factory::BVH8QuantizedQuad4i(BVH8Factory *this,Scene *scene)

{
  long lVar1;
  int iVar2;
  BVHN<8> *this_00;
  Builder *pBVar3;
  Accel *pAVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  Intersectors intersectors;
  long local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  BVHN<8> *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  Intersector1 aIStack_120 [7];
  
  this_00 = (BVHN<8> *)alignedMalloc(0x240,0x10);
  BVHN<8>::BVHN(this_00,(PrimitiveType *)&QuadMi<4>::type,scene);
  local_128 = 0;
  aIStack_120[0].intersect = (IntersectFunc)0x0;
  local_138 = 0;
  uStack_130 = 0;
  aIStack_120[0].occluded = (OccludedFunc)0x0;
  memset(&aIStack_120[0].name,0,0xe0);
  local_140 = this_00;
  (*this->QBVH8Quad4iIntersector1Pluecker)(aIStack_120);
  iVar2 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
  if (iVar2 == 0) {
    pBVar3 = (*this->BVH8QuantizedQuad4iSceneBuilderSAH)(this_00,scene,0);
    pAVar4 = (Accel *)alignedMalloc(0x180,0x10);
    (pAVar4->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
         0x7f8000007f800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
         0xff800000ff800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
         0x7f8000007f800000;
    *(undefined8 *)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
    *(undefined8 *)((long)&(pAVar4->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
         0xff800000ff800000;
    (pAVar4->super_AccelData).type = TY_ACCEL_INSTANCE;
    (pAVar4->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_0218aba8;
    memcpy(&(pAVar4->super_AccelData).field_0x58,&local_140,0x118);
    (pAVar4->super_AccelData).super_RefCount._vptr_RefCount =
         (_func_int **)&PTR__AccelInstance_0218ab40;
    pAVar4[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
    pAVar4[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict)pBVar3;
    return pAVar4;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::operator+(&local_160,"unknown builder ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)&(scene->super_AccelN).field_0x188 + 0xf0));
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  plVar8 = (long *)*plVar6;
  plVar7 = plVar6 + 2;
  if (plVar8 == plVar7) {
    local_170 = *plVar7;
    uStack_168 = (undefined4)plVar6[3];
    uStack_164 = *(undefined4 *)((long)plVar6 + 0x1c);
    plVar8 = &local_170;
  }
  else {
    local_170 = *plVar7;
  }
  lVar1 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  *puVar5 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar5 + 1) = 2;
  puVar5[2] = puVar5 + 4;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar5 + 2),plVar8,lVar1 + (long)plVar8);
  __cxa_throw(puVar5,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

Accel* BVH8Factory::BVH8QuantizedQuad4i(Scene* scene)
  {
    BVH8* accel = new BVH8(Quad4i::type,scene);
    Accel::Intersectors intersectors = QBVH8Quad4iIntersectors(accel);
    Builder* builder = nullptr;
    if      (scene->device->quad_builder == "default"     ) builder = BVH8QuantizedQuad4iSceneBuilderSAH(accel,scene,0);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->quad_builder+" for QBVH8<Quad4i>");
    return new AccelInstance(accel,builder,intersectors);
  }